

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O3

bool __thiscall Tetris::place(Tetris *this)

{
  GameBoard *pGVar1;
  bool bVar2;
  int *piVar3;
  long lVar4;
  
  bVar2 = onGround(this);
  if (bVar2) {
    pGVar1 = this->gameBoard;
    piVar3 = *this->shape + 1;
    lVar4 = 4;
    do {
      pGVar1->gridInfo[this->color]
      [(long)piVar3[(long)this->orientation * 8 + -1] + (long)this->blockX]
      [(long)piVar3[(long)this->orientation * 8] + (long)this->blockY] = 2;
      piVar3 = piVar3 + 2;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  return bVar2;
}

Assistant:

bool Tetris::place()
{
    if (!onGround())
        return false;

    int i, tmpX, tmpY;
    for (i = 0; i < 4; i++) {
        tmpX = blockX + shape[orientation][2 * i];
        tmpY = blockY + shape[orientation][2 * i + 1];
        gameBoard->gridInfo[color][tmpX][tmpY] = 2;
    }
    return true;
}